

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__open_cloexec(char *path,int flags)

{
  int iVar1;
  int *piVar2;
  int fd;
  int err;
  int flags_local;
  char *path_local;
  
  if (uv__open_cloexec::no_cloexec == 0) {
    iVar1 = open(path,flags | 0x80000);
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x16) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    uv__open_cloexec::no_cloexec = 1;
  }
  path_local._4_4_ = open(path,flags);
  if (path_local._4_4_ == -1) {
    piVar2 = __errno_location();
    path_local._4_4_ = -*piVar2;
  }
  else {
    iVar1 = uv__cloexec_ioctl(path_local._4_4_,1);
    if (iVar1 != 0) {
      uv__close(path_local._4_4_);
      path_local._4_4_ = iVar1;
    }
  }
  return path_local._4_4_;
}

Assistant:

int uv__open_cloexec(const char* path, int flags) {
  int err;
  int fd;

#if defined(UV__O_CLOEXEC)
  static int no_cloexec;

  if (!no_cloexec) {
    fd = open(path, flags | UV__O_CLOEXEC);
    if (fd != -1)
      return fd;

    if (errno != EINVAL)
      return UV__ERR(errno);

    /* O_CLOEXEC not supported. */
    no_cloexec = 1;
  }
#endif

  fd = open(path, flags);
  if (fd == -1)
    return UV__ERR(errno);

  err = uv__cloexec(fd, 1);
  if (err) {
    uv__close(fd);
    return err;
  }

  return fd;
}